

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O1

cmListFileBacktrace * __thiscall
cmDebugger_impl::GetBacktrace(cmListFileBacktrace *__return_storage_ptr__,cmDebugger_impl *this)

{
  cmGlobalGenerator *pcVar1;
  
  pcVar1 = this->CMakeInstance->GlobalGenerator;
  if (pcVar1 == (cmGlobalGenerator *)0x0) {
    cmListFileBacktrace::cmListFileBacktrace(__return_storage_ptr__);
  }
  else {
    cmMakefile::GetBacktrace(__return_storage_ptr__,pcVar1->CurrentConfigureMakefile);
  }
  return __return_storage_ptr__;
}

Assistant:

cmListFileBacktrace GetBacktrace() const override
  {
    if (this->CMakeInstance.GetGlobalGenerator()) {
      return this->CMakeInstance.GetGlobalGenerator()
        ->GetCurrentMakefile()
        ->GetBacktrace();
    }

    cmListFileBacktrace empty;
    return empty;
  }